

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::DecodeTransformOrder(u64 Input,str Output)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  
  lVar2 = 0;
  if (Input != 0) {
    do {
      uVar4 = (uint)Input & 3;
      cVar3 = (char)uVar4 + 'X';
      if (uVar4 == 3) {
        cVar3 = '+';
      }
      Output[lVar2] = cVar3;
      lVar2 = lVar2 + 1;
      bVar1 = 3 < Input;
      Input = Input >> 2;
    } while (bVar1);
  }
  Output[lVar2] = '\0';
  return;
}

Assistant:

void
DecodeTransformOrder(u64 Input, str Output)
{
  int Len = 0;
  while (Input != 0)
  {
    int T = Input & 0x3;
    Output[Len++] = T == 3 ? '+' : char('X' + T);
    Input >>= 2;
  }
  Output[Len] = '\0';
}